

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evotiming.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ptime_t pVar2;
  undefined1 local_48 [8];
  timeval end;
  timeval start;
  uint local_20;
  int cnum;
  int i;
  int c;
  char **argv_local;
  int argc_local;
  
  start.tv_usec._4_4_ = 0;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    while (iVar1 = getopt(argc,argv,"c:"), iVar1 != -1) {
      if (iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",(undefined1 *)((long)&start.tv_usec + 4));
      }
    }
    if (start.tv_usec._4_4_ < nva_cardsnum) {
      gettimeofday((timeval *)&end.tv_usec,(__timezone_ptr_t)0x0);
      gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
      local_20 = 0;
      while (pVar2 = time_diff_us(stack0xffffffffffffffc8,_local_48), pVar2 < 1000000) {
        evosend(start.tv_usec._4_4_,0,0x80,0);
        gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
        local_20 = local_20 + 1;
      }
      printf("%d evo 0x80 commands in 1 sec\n",(ulong)local_20);
      argv_local._4_4_ = 0;
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	int c, i;
	int cnum =0;
	struct timeval start, end;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	gettimeofday(&start, NULL);
	gettimeofday(&end, NULL);

	for (i=0 ; time_diff_us(start, end) < 1000000 ; i++) {
		evosend(cnum, 0, 0x80, 0);
		gettimeofday(&end, NULL);
	};

	printf("%d evo 0x80 commands in 1 sec\n", i);
	return 0;
}